

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::readQualities(Graph *this)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  long *plVar5;
  reference this_00;
  int local_404;
  stringstream local_400 [4];
  int num;
  stringstream ss;
  vector<int,_std::allocator<int>_> local_278 [2];
  int local_244;
  string local_240 [4];
  int row;
  string quality;
  istream local_220 [8];
  fstream file;
  Graph *this_local;
  
  std::fstream::fstream(local_220,"qualities.qual",_S_in);
  std::__cxx11::string::string(local_240);
  local_244 = -1;
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_240);
    if (*pcVar4 == '>') {
      local_278[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_278[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_278[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(local_278);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&this->qualities,local_278);
      std::vector<int,_std::allocator<int>_>::~vector(local_278);
      local_244 = local_244 + 1;
    }
    else {
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_400,local_240,_Var3);
      while( true ) {
        plVar5 = (long *)std::istream::operator>>((istream *)local_400,&local_404);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
        if (!bVar2) break;
        this_00 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&this->qualities,(long)local_244);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_404);
      }
      std::__cxx11::stringstream::~stringstream(local_400);
    }
  }
  std::__cxx11::string::~string(local_240);
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void Graph::readQualities(){
    fstream file("qualities.qual", ios::in);
    string quality;
    int row = -1;
    while(!file.eof()){
        getline(file, quality);
        if(quality[0] == '>'){
            this->qualities.emplace_back(vector<int>());
            row++;
            continue;
        }else{
            stringstream ss(quality);
            int num;
            while(ss >> num){
                this->qualities[row].push_back(num);
            }
        }
    }
}